

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_conn.cc
# Opt level: O0

void __thiscall CSocekt::flyd_free_connection(CSocekt *this,lp_connection_t pConn)

{
  flyd_connection_s *in_RDI;
  MutexLockGuard lock;
  MutexLock *in_stack_ffffffffffffffc8;
  value_type *in_stack_ffffffffffffffd8;
  list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_> *in_stack_ffffffffffffffe0;
  
  muduo::MutexLockGuard::MutexLockGuard((MutexLockGuard *)in_RDI,in_stack_ffffffffffffffc8);
  flyd_connection_s::PutOneToFree(in_RDI);
  std::__cxx11::list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::push_back
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  muduo::detail::AtomicIntegerT<int>::increment((AtomicIntegerT<int> *)0x13e9ce);
  muduo::MutexLockGuard::~MutexLockGuard((MutexLockGuard *)0x13e9da);
  return;
}

Assistant:

void CSocekt::flyd_free_connection(lp_connection_t pConn)
{
    muduo::MutexLockGuard lock(m_connectionMutex);

    //首先明确一点，连接，所有连接全部都在m_connectionList里；
    pConn->PutOneToFree();

    //扔到空闲连接列表里
    m_freeconnectionList.push_back(pConn);

    //空闲连接数+1
    m_free_connection_n.increment();

    return;
}